

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
SetProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 index;
  undefined4 *puVar6;
  undefined4 in_register_00000084;
  int local_54;
  SimpleDictionaryPropertyDescriptor<int> *pSStack_50;
  int i;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,flags);
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4f9,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar4)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = pSVar1->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar4) {
    BVar5 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
            SetPropertyFromDescriptor<true,int>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,
                       instance,propertyId,propertyId,pSStack_50,value,
                       (PropertyOperationFlags)local_38,(PropertyValueInfo *)propertyRecord);
  }
  else if (*(char *)(descriptor + 2) == '\x01') {
    index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
    BVar5 = DynamicObject::SetObjectArrayItem(instance,index,value,(PropertyOperationFlags)local_38)
    ;
  }
  else {
    BVar5 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
            AddProperty<Js::PropertyRecord_const*>
                      ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,
                       instance,(PropertyRecord *)descriptor,value,'\a',
                       (PropertyValueInfo *)propertyRecord,(PropertyOperationFlags)local_38,
                       SideEffects_Any);
  }
  return BVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        // It can be the case that propertyRecord is a symbol property and it has the same string description as
        // another property which is in the propertyMap. If we are in a string-keyed type handler, the propertyMap
        // will find that normal property when we call TryGetReference with the symbol propertyRecord. However,
        // we don't want to update that descriptor with value since the two properties are actually different.
        // In fact, we can't store a symbol in a string-keyed type handler at all since the string description
        // is not used for symbols. Instead, we want to skip searching for the descriptor if we are in a string-keyed
        // type handler. When we call AddProperty with the symbol propertyRecord, it should convert us to a
        // const PropertyRecord* - keyed type handler anyway.
        if (!(TMapKey_IsJavascriptString<TMapKey>() && propertyRecord->IsSymbol())
            && propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return SetPropertyFromDescriptor<allowLetConstGlobal>(instance, propertyId, propertyId, descriptor, value, flags, info);
        }

        // Always check numeric propertyId. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return this->SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }

        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }